

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.h
# Opt level: O2

void __thiscall
mocker::detail::RegisterAllocator::RegisterAllocator
          (RegisterAllocator *this,Section *section,LineIter funcBeg,LineIter funcEnd)

{
  this->section = section;
  (this->funcBeg)._M_node = funcBeg._M_node;
  (this->funcEnd)._M_node = funcEnd._M_node;
  InterferenceGraph::InterferenceGraph(&this->interG);
  MoveInfo::MoveInfo(&this->moveInfo);
  (this->spilledLastTime)._M_h._M_buckets = &(this->spilledLastTime)._M_h._M_single_bucket;
  (this->spilledLastTime)._M_h._M_bucket_count = 1;
  (this->spilledLastTime)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->spilledLastTime)._M_h._M_element_count = 0;
  (this->spilledLastTime)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->spilledLastTime)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->spilledLastTime)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

RegisterAllocator(nasm::Section &section, LineIter funcBeg, LineIter funcEnd)
      : section(section), funcBeg(funcBeg), funcEnd(funcEnd) {}